

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

xmlChar * hash_qlookup(xmlHashTable *hash,xmlChar **names,size_t num_keys)

{
  char *pcVar1;
  xmlChar *pxVar2;
  xmlChar *colon;
  xmlChar *name;
  size_t i;
  xmlChar *res;
  xmlChar *local [3];
  xmlChar *local_38;
  xmlChar *prefix [3];
  size_t num_keys_local;
  xmlChar **names_local;
  xmlHashTable *hash_local;
  
  prefix[2] = (xmlChar *)num_keys;
  for (name = (xmlChar *)0x0; name < (xmlChar *)0x3; name = name + 1) {
    if (name < prefix[2]) {
      pxVar2 = names[(long)name];
      pcVar1 = strchr((char *)pxVar2,0x3a);
      if (pcVar1 == (char *)0x0) {
        prefix[(long)(name + -1)] = (xmlChar *)0x0;
        local[(long)(name + -1)] = pxVar2;
      }
      else {
        pxVar2 = (xmlChar *)xmlStrndup(pxVar2,(int)pcVar1 - (int)pxVar2);
        prefix[(long)(name + -1)] = pxVar2;
        local[(long)(name + -1)] = (xmlChar *)(pcVar1 + 1);
      }
    }
    else {
      prefix[(long)(name + -1)] = (xmlChar *)0x0;
      local[(long)(name + -1)] = (xmlChar *)0x0;
    }
  }
  pxVar2 = (xmlChar *)xmlHashQLookup3(hash,local_38,res,prefix[0],local[0],prefix[1],local[1]);
  for (name = (xmlChar *)0x0; name < (xmlChar *)0x3; name = name + 1) {
    (*_xmlFree)(prefix[(long)(name + -1)]);
  }
  return pxVar2;
}

Assistant:

static xmlChar *
hash_qlookup(xmlHashTable *hash, xmlChar **names, size_t num_keys) {
    xmlChar *prefix[3];
    const xmlChar *local[3];
    xmlChar *res;
    size_t i;

    for (i = 0; i < 3; ++i) {
        if (i >= num_keys) {
            prefix[i] = NULL;
            local[i] = NULL;
        } else {
            const xmlChar *name = names[i];
            const xmlChar *colon = BAD_CAST strchr((const char *) name, ':');

            if (colon == NULL) {
                prefix[i] = NULL;
                local[i] = name;
            } else {
                prefix[i] = xmlStrndup(name, colon - name);
                local[i] = &colon[1];
            }
        }
    }

    res = xmlHashQLookup3(hash, prefix[0], local[0], prefix[1], local[1],
                          prefix[2], local[2]);

    for (i = 0; i < 3; ++i)
        xmlFree(prefix[i]);

    return res;
}